

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateFieldAccessor
               (FieldDescriptor *field,bool is_descriptor,Printer *printer)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Descriptor *pDVar4;
  FieldDescriptor *pFVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *plVar7;
  EnumDescriptor *pEVar8;
  undefined8 *puVar9;
  uint uVar10;
  int32 value;
  int32 extraout_EDX;
  int32 extraout_EDX_00;
  int32 extraout_EDX_01;
  int32 extraout_EDX_02;
  int32 extraout_EDX_03;
  int32 extraout_EDX_04;
  int32 extraout_EDX_05;
  int32 extraout_EDX_06;
  int32 extraout_EDX_07;
  int32 extraout_EDX_08;
  int32 extraout_EDX_09;
  int32 extraout_EDX_10;
  int32 extraout_EDX_11;
  int32 value_00;
  size_type sVar11;
  undefined7 in_register_00000031;
  char *pcVar12;
  _Alloc_hider _Var13;
  long lVar14;
  string out_1;
  string out;
  string local_d0;
  string local_b0;
  long local_90;
  allocator local_81;
  undefined1 local_80 [32];
  FieldDescriptor *local_60;
  long local_58;
  FieldDescriptor local_50 [16];
  _func_void_FieldDescriptor_ptr *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  lVar14 = *(long *)(field + 0x58);
  GenerateFieldDocComment(printer,field,(int)CONCAT71(in_register_00000031,is_descriptor),2);
  if (lVar14 == 0) {
    UnderscoresToCamelCase(&local_d0,*(string **)field,true);
    io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"public function get^camel_name^()\n{\n    return $this->^name^;\n}\n\n",
               (char (*) [11])"camel_name",&local_d0,(char (*) [5])0x3918cc,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  else {
    UnderscoresToCamelCase(&local_d0,*(string **)field,true);
    IntToString_abi_cxx11_(&local_b0,(php *)(ulong)*(uint *)(field + 0x44),value);
    io::Printer::Print<char[11],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,
               "public function get^camel_name^()\n{\n    return $this->readOneof(^number^);\n}\n\n"
               ,(char (*) [11])"camel_name",&local_d0,(char (*) [7])0x3afc71,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b0._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
               (FieldDescriptor **)&local_b0);
  }
  if (((*(int *)(field + 0x38) != 0xb) ||
      (bVar1 = FieldDescriptor::is_map_message_type(field), !bVar1)) &&
     (*(int *)(field + 0x3c) != 3)) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b0._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                 (FieldDescriptor **)&local_b0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b0._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                   (FieldDescriptor **)&local_b0);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10)
        goto LAB_0026bed6;
      }
      pDVar4 = FieldDescriptor::message_type(field);
      iVar2 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar4 + 0x10));
      if (iVar2 == 0) {
        GenerateWrapperFieldGetterDocComment(printer,field);
        UnderscoresToCamelCase(&local_d0,*(string **)field,true);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,
                   "public function get^camel_name^Unwrapped()\n{\n    $wrapper = $this->get^camel_name^();\n    return is_null($wrapper) ? null : $wrapper->getValue();\n}\n\n"
                   ,(char (*) [11])"camel_name",&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
    }
  }
LAB_0026bed6:
  local_90 = lVar14;
  GenerateFieldDocComment(printer,field,(uint)is_descriptor,1);
  UnderscoresToCamelCase(&local_d0,*(string **)field,true);
  io::Printer::Print<char[11],std::__cxx11::string>
            (printer,"public function set^camel_name^($var)\n{\n",(char (*) [11])"camel_name",
             &local_d0);
  paVar6 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar6) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b0._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
               (FieldDescriptor **)&local_b0);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar1 = FieldDescriptor::is_map_message_type(field), bVar1)) {
    pDVar4 = FieldDescriptor::message_type(field);
    local_d0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"key","");
    pFVar5 = Descriptor::FindFieldByName(pDVar4,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"value","");
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)Descriptor::FindFieldByName(pDVar4,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (*(once_flag **)(pFVar5 + 0x30) != (once_flag *)0x0) {
      local_80._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = pFVar5;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar5 + 0x30),(_func_void_FieldDescriptor_ptr **)local_80,
                 &local_60);
    }
    std::__cxx11::string::string
              ((string *)&local_b0,
               *(char **)(FieldDescriptor::kTypeToName + (ulong)*(uint *)(pFVar5 + 0x38) * 8),
               &local_81);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_b0._M_dataplus._M_p,
               (FieldDescriptor *)(local_b0._M_dataplus._M_p + local_b0._M_string_length));
    if (local_d0._M_string_length != 0) {
      sVar11 = 0;
      do {
        if ((byte)((char)*(FieldDescriptor *)(local_d0._M_dataplus._M_p + sVar11) + 0x9fU) < 0x1a) {
          *(char *)(local_d0._M_dataplus._M_p + sVar11) =
               (char)*(FieldDescriptor *)(local_d0._M_dataplus._M_p + sVar11) + -0x20;
        }
        sVar11 = sVar11 + 1;
      } while (local_d0._M_string_length != sVar11);
    }
    if (*(once_flag **)(paVar6->_M_local_buf + 0x30) != (once_flag *)0x0) {
      local_40 = FieldDescriptor::TypeOnceInit;
      local_38 = paVar6;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(paVar6->_M_local_buf + 0x30),&local_40,
                 (FieldDescriptor **)&local_38);
    }
    std::__cxx11::string::string
              ((string *)&local_60,
               *(char **)(FieldDescriptor::kTypeToName +
                         (ulong)*(uint *)(paVar6->_M_local_buf + 0x38) * 8),(allocator *)&local_40);
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_80,local_60,local_60 + local_58);
    if (local_80._8_8_ != 0) {
      sVar11 = 0;
      do {
        if ((byte)((char)*(_func_void_FieldDescriptor_ptr *)(local_80._0_8_ + sVar11) + 0x9fU) <
            0x1a) {
          *(char *)(local_80._0_8_ + sVar11) =
               (char)*(_func_void_FieldDescriptor_ptr *)(local_80._0_8_ + sVar11) + -0x20;
        }
        sVar11 = sVar11 + 1;
      } while (local_80._8_8_ != sVar11);
    }
    io::Printer::Print<char[9],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "$arr = GPBUtil::checkMapField($var, \\Google\\Protobuf\\Internal\\GPBType::^key_type^, \\Google\\Protobuf\\Internal\\GPBType::^value_type^"
               ,(char (*) [9])0x3c90b0,&local_d0,(char (*) [11])0x3c9184,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (*(once_flag **)(paVar6->_M_local_buf + 0x30) != (once_flag *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b0._M_dataplus._M_p = (pointer)paVar6;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(paVar6->_M_local_buf + 0x30),
                 (_func_void_FieldDescriptor_ptr **)&local_d0,(FieldDescriptor **)&local_b0);
    }
    iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                    (ulong)*(uint *)(paVar6->_M_local_buf + 0x38) * 4);
    if (iVar2 == 10) {
      pDVar4 = FieldDescriptor::message_type((FieldDescriptor *)paVar6->_M_local_buf);
      FullClassName<google::protobuf::Descriptor>(&local_b0,pDVar4,is_descriptor);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar6) {
        local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_d0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)paVar6;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x395773,&local_d0);
      value_00 = extraout_EDX_06;
LAB_0026c80e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
        value_00 = extraout_EDX_10;
      }
      paVar6 = &local_b0.field_2;
      _Var13._M_p = local_b0._M_dataplus._M_p;
LAB_0026c827:
      bVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p == paVar6;
      goto LAB_0026c82a;
    }
    if (*(once_flag **)(paVar6->_M_local_buf + 0x30) != (once_flag *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b0._M_dataplus._M_p = (pointer)paVar6;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(paVar6->_M_local_buf + 0x30),
                 (_func_void_FieldDescriptor_ptr **)&local_d0,(FieldDescriptor **)&local_b0);
      iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                      (ulong)*(uint *)(paVar6->_M_local_buf + 0x38) * 4);
    }
    if (iVar2 == 8) {
      pEVar8 = FieldDescriptor::enum_type((FieldDescriptor *)paVar6->_M_local_buf);
      FullClassName<google::protobuf::EnumDescriptor>(&local_b0,pEVar8,is_descriptor);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 == paVar6) {
        local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_d0.field_2._8_8_ = puVar9[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_d0._M_string_length = puVar9[1];
      *puVar9 = paVar6;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x395773,&local_d0);
      value_00 = extraout_EDX_09;
      goto LAB_0026c80e;
    }
LAB_0026c5b9:
    io::Printer::Print<>(printer,");\n");
    lVar14 = local_90;
    value_00 = extraout_EDX_01;
  }
  else {
    if (*(int *)(field + 0x3c) != 3) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b0._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                   (FieldDescriptor **)&local_b0);
      }
      uVar3 = *(uint *)(field + 0x38);
      uVar10 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar3 * 4);
      if (uVar10 == 10) {
        pDVar4 = FieldDescriptor::message_type(field);
        LegacyFullClassName<google::protobuf::Descriptor>(&local_d0,pDVar4,is_descriptor);
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,"GPBUtil::checkMessage($var, \\^class_name^::class);\n",
                   (char (*) [11])0x395773,&local_d0);
        value_00 = extraout_EDX;
LAB_0026c48d:
        paVar6 = &local_d0.field_2;
        _Var13._M_p = local_d0._M_dataplus._M_p;
      }
      else {
        if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_b0._M_dataplus._M_p = (pointer)field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                     (FieldDescriptor **)&local_b0);
          uVar3 = *(uint *)(field + 0x38);
          uVar10 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar3 * 4);
        }
        if (uVar10 == 8) {
          pEVar8 = FieldDescriptor::enum_type(field);
          LegacyFullClassName<google::protobuf::EnumDescriptor>(&local_d0,pEVar8,is_descriptor);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (printer,"GPBUtil::checkEnum($var, \\^class_name^::class);\n",
                     (char (*) [11])0x395773,&local_d0);
          value_00 = extraout_EDX_00;
          goto LAB_0026c48d;
        }
        if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
          local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
          local_b0._M_dataplus._M_p = (pointer)field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                     (FieldDescriptor **)&local_b0);
          uVar3 = *(uint *)(field + 0x38);
          uVar10 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar3 * 4);
        }
        if (uVar10 == 9) {
          if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
            local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
            local_b0._M_dataplus._M_p = (pointer)field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                       (FieldDescriptor **)&local_b0);
            uVar3 = *(uint *)(field + 0x38);
          }
          pcVar12 = "False";
          if (uVar3 == 9) {
            pcVar12 = "True";
          }
          local_d0._M_dataplus._M_p = pcVar12;
          io::Printer::Print<char[5],char_const*>
                    (printer,"GPBUtil::checkString($var, ^utf8^);\n",(char (*) [5])0x3e13e9,
                     (char **)&local_d0);
          lVar14 = local_90;
          value_00 = extraout_EDX_02;
          goto LAB_0026c836;
        }
        if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
          local_80._0_8_ = FieldDescriptor::TypeOnceInit;
          local_60 = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_80,
                     &local_60);
          uVar10 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4
                            );
        }
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   *(char **)(FieldDescriptor::kCppTypeToName + (ulong)uVar10 * 8),
                   (allocator *)local_80);
        UnderscoresToCamelCase(&local_d0,&local_b0,true);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (printer,"GPBUtil::check^type^($var);\n",(char (*) [5])0x3e7763,&local_d0);
        value_00 = extraout_EDX_04;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
          value_00 = extraout_EDX_05;
        }
        paVar6 = &local_b0.field_2;
        _Var13._M_p = local_b0._M_dataplus._M_p;
      }
      goto LAB_0026c827;
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_80._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_80,&local_60
                );
    }
    std::__cxx11::string::string
              ((string *)&local_b0,
               *(char **)(FieldDescriptor::kTypeToName + (ulong)*(uint *)(field + 0x38) * 8),
               (allocator *)local_80);
    local_d0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_b0._M_dataplus._M_p,
               (FieldDescriptor *)(local_b0._M_dataplus._M_p + local_b0._M_string_length));
    if (local_d0._M_string_length != 0) {
      sVar11 = 0;
      do {
        if ((byte)((char)*(FieldDescriptor *)(local_d0._M_dataplus._M_p + sVar11) + 0x9fU) < 0x1a) {
          *(char *)(local_d0._M_dataplus._M_p + sVar11) =
               (char)*(FieldDescriptor *)(local_d0._M_dataplus._M_p + sVar11) + -0x20;
        }
        sVar11 = sVar11 + 1;
      } while (local_d0._M_string_length != sVar11);
    }
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "$arr = GPBUtil::checkRepeatedField($var, \\Google\\Protobuf\\Internal\\GPBType::^type^"
               ,(char (*) [5])0x3e7763,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar6) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b0._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                 (FieldDescriptor **)&local_b0);
    }
    iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
    if (iVar2 == 10) {
      pDVar4 = FieldDescriptor::message_type(field);
      FullClassName<google::protobuf::Descriptor>(&local_b0,pDVar4,is_descriptor);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 == paVar6) {
        local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_d0.field_2._8_8_ = puVar9[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_d0._M_string_length = puVar9[1];
      *puVar9 = paVar6;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x395773,&local_d0);
      value_00 = extraout_EDX_03;
    }
    else {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b0._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                   (FieldDescriptor **)&local_b0);
        iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4);
      }
      if (iVar2 != 8) goto LAB_0026c5b9;
      pEVar8 = FieldDescriptor::enum_type(field);
      FullClassName<google::protobuf::EnumDescriptor>(&local_b0,pEVar8,is_descriptor);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 == paVar6) {
        local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_d0.field_2._8_8_ = puVar9[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_d0._M_string_length = puVar9[1];
      *puVar9 = paVar6;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,", \\^class_name^);\n",(char (*) [11])0x395773,&local_d0);
      value_00 = extraout_EDX_07;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      value_00 = extraout_EDX_08;
    }
    bVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2;
    _Var13._M_p = local_b0._M_dataplus._M_p;
LAB_0026c82a:
    lVar14 = local_90;
    if (!bVar1) {
      operator_delete(_Var13._M_p);
      value_00 = extraout_EDX_11;
    }
  }
LAB_0026c836:
  if (lVar14 == 0) {
    if (*(int *)(field + 0x3c) == 3) {
      pcVar12 = "$this->^name^ = $arr;\n";
    }
    else {
      pcVar12 = "$this->^name^ = $var;\n";
    }
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,pcVar12,(char (*) [5])0x3918cc,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  else {
    IntToString_abi_cxx11_(&local_d0,(php *)(ulong)*(uint *)(field + 0x44),value_00);
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,"$this->writeOneof(^number^, $var);\n",(char (*) [7])0x3afc71,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (is_descriptor) {
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"$this->has_^field_name^ = true;\n",(char (*) [11])0x3afb48,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
  }
  io::Printer::Print<>(printer,"\nreturn $this;\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n\n");
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b0._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
               (FieldDescriptor **)&local_b0);
  }
  if (((*(int *)(field + 0x38) != 0xb) ||
      (bVar1 = FieldDescriptor::is_map_message_type(field), !bVar1)) &&
     (*(int *)(field + 0x3c) != 3)) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b0._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                 (FieldDescriptor **)&local_b0);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_d0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_b0._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_d0,
                   (FieldDescriptor **)&local_b0);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10)
        goto LAB_0026ca4c;
      }
      pDVar4 = FieldDescriptor::message_type(field);
      iVar2 = std::__cxx11::string::compare((char *)**(undefined8 **)(pDVar4 + 0x10));
      if (iVar2 == 0) {
        GenerateWrapperFieldSetterDocComment(printer,field);
        UnderscoresToCamelCase(&local_d0,*(string **)field,true);
        pDVar4 = FieldDescriptor::message_type(field);
        LegacyFullClassName<google::protobuf::Descriptor>(&local_b0,pDVar4,is_descriptor);
        io::Printer::Print<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                  (printer,
                   "public function set^camel_name^Unwrapped($var)\n{\n    $wrappedVar = is_null($var) ? null : new \\^wrapper_type^([\'value\' => $var]);\n    return $this->set^camel_name^($wrappedVar);\n}\n\n"
                   ,(char (*) [11])"camel_name",&local_d0,(char (*) [13])"wrapper_type",&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
      }
    }
  }
LAB_0026ca4c:
  if (is_descriptor) {
    UnderscoresToCamelCase(&local_d0,*(string **)field,true);
    io::Printer::Print<char[11],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "public function has^camel_name^()\n{\n    return $this->has_^field_name^;\n}\n\n",
               (char (*) [11])"camel_name",&local_d0,(char (*) [11])0x3afb48,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void GenerateFieldAccessor(const FieldDescriptor* field, bool is_descriptor,
                           io::Printer* printer) {
  const OneofDescriptor* oneof = field->containing_oneof();

  // Generate getter.
  if (oneof != NULL) {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldGetter);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->readOneof(^number^);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "number", IntToString(field->number()));
  } else {
    GenerateFieldDocComment(printer, field, is_descriptor, kFieldGetter);
    printer->Print(
        "public function get^camel_name^()\n"
        "{\n"
        "    return $this->^name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true), "name",
        field->name());
  }

  // For wrapper types, generate an additional getXXXUnwrapped getter
  if (!field->is_map() &&
      !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldGetterDocComment(printer, field);
    printer->Print(
        "public function get^camel_name^Unwrapped()\n"
        "{\n"
        "    $wrapper = $this->get^camel_name^();\n"
        "    return is_null($wrapper) ? null : $wrapper->getValue();\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  // Generate setter.
  GenerateFieldDocComment(printer, field, is_descriptor, kFieldSetter);
  printer->Print(
      "public function set^camel_name^($var)\n"
      "{\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));

  Indent(printer);

  // Type check.
  if (field->is_map()) {
    const Descriptor* map_entry = field->message_type();
    const FieldDescriptor* key = map_entry->FindFieldByName("key");
    const FieldDescriptor* value = map_entry->FindFieldByName("value");
    printer->Print(
        "$arr = GPBUtil::checkMapField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^key_type^, "
        "\\Google\\Protobuf\\Internal\\GPBType::^value_type^",
        "key_type", ToUpper(key->type_name()),
        "value_type", ToUpper(value->type_name()));
    if (value->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->message_type(), is_descriptor) + "::class");
    } else if (value->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(value->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->is_repeated()) {
    printer->Print(
        "$arr = GPBUtil::checkRepeatedField($var, "
        "\\Google\\Protobuf\\Internal\\GPBType::^type^",
        "type", ToUpper(field->type_name()));
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->message_type(), is_descriptor) + "::class");
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
          ", \\^class_name^);\n",
          "class_name",
          FullClassName(field->enum_type(), is_descriptor) + "::class");
    } else {
      printer->Print(");\n");
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    printer->Print(
        "GPBUtil::checkMessage($var, \\^class_name^::class);\n",
        "class_name", LegacyFullClassName(field->message_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    printer->Print(
        "GPBUtil::checkEnum($var, \\^class_name^::class);\n",
        "class_name", LegacyFullClassName(field->enum_type(), is_descriptor));
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    printer->Print(
        "GPBUtil::checkString($var, ^utf8^);\n",
        "utf8",
        field->type() == FieldDescriptor::TYPE_STRING ? "True": "False");
  } else {
    printer->Print(
        "GPBUtil::check^type^($var);\n",
        "type", UnderscoresToCamelCase(field->cpp_type_name(), true));
  }

  if (oneof != NULL) {
    printer->Print(
        "$this->writeOneof(^number^, $var);\n",
        "number", IntToString(field->number()));
  } else if (field->is_repeated()) {
    printer->Print(
        "$this->^name^ = $arr;\n",
        "name", field->name());
  } else {
    printer->Print(
        "$this->^name^ = $var;\n",
        "name", field->name());
  }

  // Set has bit for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "$this->has_^field_name^ = true;\n",
        "field_name", field->name());
  }

  printer->Print("\nreturn $this;\n");

  Outdent(printer);

  printer->Print(
      "}\n\n");

  // For wrapper types, generate an additional setXXXValue getter
  if (!field->is_map() &&
      !field->is_repeated() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      IsWrapperType(field)) {
    GenerateWrapperFieldSetterDocComment(printer, field);
    printer->Print(
        "public function set^camel_name^Unwrapped($var)\n"
        "{\n"
        "    $wrappedVar = is_null($var) ? null : new \\^wrapper_type^(['value' => $var]);\n"
        "    return $this->set^camel_name^($wrappedVar);\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "wrapper_type", LegacyFullClassName(field->message_type(), is_descriptor));
  }

  // Generate has method for proto2 only.
  if (is_descriptor) {
    printer->Print(
        "public function has^camel_name^()\n"
        "{\n"
        "    return $this->has_^field_name^;\n"
        "}\n\n",
        "camel_name", UnderscoresToCamelCase(field->name(), true),
        "field_name", field->name());
  }
}